

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O2

void done_outputing_bits(char *outfile)

{
  long lVar1;
  long lVar2;
  
  lVar1 = noutchar;
  lVar2 = (long)bits_to_go2;
  if (lVar2 < 8) {
    outfile[noutchar] = (char)(buffer2 << ((byte)bits_to_go2 & 0x1f));
    if (lVar1 < noutmax) {
      noutchar = lVar1 + 1;
    }
    bitcount = bitcount + lVar2;
  }
  return;
}

Assistant:

static void
done_outputing_bits(char *outfile)
{
	if(bits_to_go2 < 8) {
/*		putc(buffer2<<bits_to_go2,outfile); */

	        outfile[noutchar] = (buffer2<<bits_to_go2);
		if (noutchar < noutmax) noutchar++;

		/* count the garbage bits too */
		bitcount += bits_to_go2;
	}
}